

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
ear::Layout::isLfe(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Layout *this)

{
  pointer pCVar1;
  pointer pCVar2;
  long lVar3;
  storage_type *psVar4;
  long *local_c0 [2];
  long local_b0 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  char local_50;
  type local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  pCVar1 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_start;
  pCVar2 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar1 != pCVar2) {
    psVar4 = &(pCVar1->_elevationRange).super_type.m_storage;
    do {
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,*(long *)((long)(psVar4 + -8) + 8),
                 *(long *)(psVar4 + -7) + *(long *)((long)(psVar4 + -8) + 8));
      local_90 = *(undefined8 *)((long)(psVar4 + -5) + 8);
      local_a0 = *(undefined8 *)((long)(psVar4 + -6) + 8);
      uStack_98 = *(undefined8 *)(psVar4 + -5);
      local_88 = *(char *)(psVar4 + -4) == '\x01';
      if ((bool)local_88) {
        local_70 = *(undefined8 *)((long)(psVar4 + -3) + 8);
        local_80 = *(undefined8 *)((long)(psVar4 + -4) + 8);
        uStack_78 = *(undefined8 *)(psVar4 + -3);
      }
      local_68 = *(char *)(psVar4 + -2) == '\x01';
      if ((bool)local_68) {
        local_60 = *(undefined8 *)((long)(psVar4 + -2) + 8);
        uStack_58 = *(undefined8 *)(psVar4 + -1);
      }
      local_50 = *(char *)((long)(psVar4 + -1) + 8) == '\x01';
      if ((bool)local_50) {
        local_48 = (psVar4->dummy_).aligner_;
        uStack_40 = *(undefined8 *)((long)&psVar4->dummy_ + 8);
      }
      local_38 = *(undefined1 *)(psVar4 + 1);
      std::vector<bool,_std::allocator<bool>_>::push_back(__return_storage_ptr__,(bool)local_38);
      if (local_50 == '\x01') {
        local_50 = '\0';
      }
      if (local_68 == '\x01') {
        local_68 = '\0';
      }
      if (local_88 == '\x01') {
        local_88 = '\0';
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
      lVar3 = (long)(psVar4 + 1);
      psVar4 = psVar4 + 9;
    } while ((pointer)(lVar3 + 8) != pCVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> Layout::isLfe() const {
    std::vector<bool> isLfeMapping;
    std::transform(_channels.begin(), _channels.end(),
                   std::back_inserter(isLfeMapping),
                   [](Channel c) -> bool { return c.isLfe(); });
    return isLfeMapping;
  }